

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyboard.c
# Opt level: O0

void keyboard_tick(void)

{
  int i;
  
  for (i = 0; i < 0xe3; i = i + 1) {
    key_array[i] = key_array[i] & 0xfffffffd;
    key_array[i] = key_array[i] & 0xfffffffb;
  }
  unicode_count = 0;
  return;
}

Assistant:

void keyboard_tick(void)
{
   /* clear pressed/released bits */
   int i;
   for (i = 0; i < ALLEGRO_KEY_MAX; i++) {
      key_array[i] &= ~(1 << 1);
      key_array[i] &= ~(1 << 2);
   }
   
   unicode_count = 0;
}